

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O3

void finish_pass1(j_decompress_ptr cinfo)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  jpeg_color_quantizer *pjVar6;
  jpeg_error_mgr *pjVar7;
  boxptr boxp_00;
  ulong uVar8;
  long lVar9;
  boxptr pbVar10;
  long lVar11;
  boxptr boxp;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  boxptr which;
  boxptr boxp_01;
  long lVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  int *piVar26;
  char cVar27;
  int iVar28;
  ulong uVar29;
  
  pjVar6 = cinfo->cquantize;
  cinfo->colormap = (JSAMPARRAY)pjVar6[1].start_pass;
  uVar1 = *(uint *)&pjVar6[1].color_quantize;
  uVar29 = (ulong)(int)uVar1;
  uVar16 = 1;
  boxp_00 = (boxptr)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,uVar29 * 0x28);
  boxp_00->c0min = 0;
  boxp_00->c0max = 0x1f;
  boxp_00->c1min = 0;
  boxp_00->c1max = 0x3f;
  boxp_00->c2min = 0;
  boxp_00->c2max = 0x1f;
  update_box(cinfo,boxp_00);
  if (1 < (long)uVar29) {
    uVar17 = 1;
    do {
      if (uVar17 * 2 < uVar29 || uVar17 * 2 - uVar29 == 0) {
        boxp_01 = (boxptr)0x0;
        lVar19 = 0;
        uVar8 = uVar17;
        pbVar10 = boxp_00;
        do {
          if ((lVar19 < pbVar10->colorcount) && (0 < pbVar10->volume)) {
            lVar19 = pbVar10->colorcount;
            boxp_01 = pbVar10;
          }
          pbVar10 = pbVar10 + 1;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      else {
        boxp_01 = (boxptr)0x0;
        lVar19 = 0;
        uVar8 = uVar17;
        pbVar10 = boxp_00;
        do {
          if (lVar19 < pbVar10->volume) {
            boxp_01 = pbVar10;
            lVar19 = pbVar10->volume;
          }
          pbVar10 = pbVar10 + 1;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      if (boxp_01 == (boxptr)0x0) {
        uVar16 = (uint)uVar17;
        break;
      }
      iVar2 = boxp_01->c0max;
      boxp_00[uVar17].c0max = iVar2;
      iVar3 = boxp_01->c1max;
      boxp_00[uVar17].c1max = iVar3;
      iVar28 = boxp_01->c2max;
      boxp_00[uVar17].c2max = iVar28;
      iVar4 = boxp_01->c0min;
      boxp_00[uVar17].c0min = iVar4;
      iVar20 = boxp_01->c1min;
      boxp_00[uVar17].c1min = iVar20;
      iVar5 = boxp_01->c2min;
      boxp_00[uVar17].c2min = iVar5;
      uVar8 = (ulong)cinfo->out_color_space;
      iVar13 = (iVar3 - iVar20) * c_scales[rgb_green[uVar8]];
      iVar25 = (iVar2 - iVar4) * c_scales[rgb_red[uVar8]] * 8;
      iVar14 = iVar13 * 4;
      iVar22 = (iVar28 - iVar5) * c_scales[rgb_blue[uVar8]] * 8;
      if ((0x10c4UL >> (uVar8 & 0x3f) & 1) == 0) {
        iVar15 = iVar14;
        if (iVar22 != iVar14 && SBORROW4(iVar22,iVar14) == iVar22 + iVar13 * -4 < 0) {
          iVar15 = iVar22;
        }
        if (iVar15 < iVar25) {
LAB_001139b0:
          piVar26 = &boxp_01->c0max;
          iVar20 = iVar4 + iVar2;
          pbVar10 = boxp_00 + uVar17;
        }
        else {
          cVar27 = (iVar14 < iVar22) + '\x01';
LAB_0011396a:
          if (cVar27 == '\x02') goto LAB_00113994;
          if (cVar27 != '\x01') goto LAB_001139b0;
          piVar26 = &boxp_01->c1max;
          iVar20 = iVar20 + iVar3;
          pbVar10 = (boxptr)&boxp_00[uVar17].c1min;
        }
      }
      else {
        cVar27 = iVar25 <= iVar14;
        if (iVar25 != iVar14 && SBORROW4(iVar25,iVar14) == iVar25 + iVar13 * -4 < 0) {
          iVar14 = iVar25;
        }
        if (iVar22 <= iVar14) goto LAB_0011396a;
LAB_00113994:
        piVar26 = &boxp_01->c2max;
        pbVar10 = (boxptr)&boxp_00[uVar17].c2min;
        iVar20 = iVar5 + iVar28;
      }
      *piVar26 = iVar20 / 2;
      pbVar10->c0min = iVar20 / 2 + 1;
      update_box(cinfo,boxp_01);
      update_box(cinfo,boxp_00 + uVar17);
      uVar17 = uVar17 + 1;
      uVar16 = uVar1;
    } while (uVar17 != uVar29);
    if ((int)uVar16 < 1) goto LAB_00113bbc;
  }
  uVar29 = 0;
  do {
    lVar19 = (long)boxp_00[uVar29].c0min;
    if (boxp_00[uVar29].c0max < boxp_00[uVar29].c0min) {
      lVar23 = 0;
      lVar9 = 0;
      lVar11 = 0;
      lVar24 = 0;
    }
    else {
      iVar2 = boxp_00[uVar29].c2min;
      iVar3 = boxp_00[uVar29].c1min;
      lVar24 = 0;
      lVar11 = 0;
      lVar9 = 0;
      lVar23 = 0;
      do {
        if (iVar3 <= boxp_00[uVar29].c1max) {
          lVar21 = *(long *)(cinfo->cquantize[1].finish_pass + lVar19 * 8) +
                   (long)iVar3 * 0x40 + (long)iVar2 * 2;
          lVar18 = (long)iVar3;
          do {
            if (iVar2 <= boxp_00[uVar29].c2max) {
              lVar12 = 0;
              iVar28 = iVar2 * 8 + 4;
              do {
                uVar17 = (ulong)*(ushort *)(lVar21 + lVar12 * 2);
                if (uVar17 != 0) {
                  lVar23 = lVar23 + uVar17;
                  lVar9 = lVar9 + uVar17 * (long)((int)lVar19 * 8 + 4);
                  lVar11 = lVar11 + uVar17 * (long)((int)lVar18 * 4 + 2);
                  lVar24 = lVar24 + (long)iVar28 * uVar17;
                }
                lVar12 = lVar12 + 1;
                iVar28 = iVar28 + 8;
              } while ((boxp_00[uVar29].c2max - iVar2) + 1 != (int)lVar12);
            }
            lVar18 = lVar18 + 1;
            lVar21 = lVar21 + 0x40;
          } while (boxp_00[uVar29].c1max + 1 != (int)lVar18);
        }
        lVar19 = lVar19 + 1;
      } while (boxp_00[uVar29].c0max + 1 != (int)lVar19);
    }
    lVar19 = lVar23 >> 1;
    (*cinfo->colormap)[uVar29] = (JSAMPLE)((lVar9 + lVar19) / lVar23);
    cinfo->colormap[1][uVar29] = (JSAMPLE)((lVar11 + lVar19) / lVar23);
    cinfo->colormap[2][uVar29] = (JSAMPLE)((lVar19 + lVar24) / lVar23);
    uVar29 = uVar29 + 1;
  } while (uVar29 != uVar16);
LAB_00113bbc:
  cinfo->actual_number_of_colors = uVar16;
  pjVar7 = cinfo->err;
  pjVar7->msg_code = 0x60;
  (pjVar7->msg_parm).i[0] = uVar16;
  (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
  *(undefined4 *)&pjVar6[1].new_color_map = 1;
  return;
}

Assistant:

METHODDEF(void)
finish_pass1(j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;

  /* Select the representative colors and fill in cinfo->colormap */
  cinfo->colormap = cquantize->sv_colormap;
  select_colors(cinfo, cquantize->desired);
  /* Force next pass to zero the color index table */
  cquantize->needs_zeroed = TRUE;
}